

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IXCobraConnection.cpp
# Opt level: O3

void __thiscall ix::CobraConnection::~CobraConnection(CobraConnection *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Manager_type p_Var2;
  pointer pcVar3;
  _Any_data local_28;
  code *local_18;
  undefined8 uStack_10;
  
  LOCK();
  (this->_authenticated)._M_base._M_i = false;
  UNLOCK();
  WebSocket::stop((this->_webSocket)._M_t.
                  super___uniq_ptr_impl<ix::WebSocket,_std::default_delete<ix::WebSocket>_>._M_t.
                  super__Tuple_impl<0UL,_ix::WebSocket_*,_std::default_delete<ix::WebSocket>_>.
                  super__Head_base<0UL,_ix::WebSocket_*,_false>._M_head_impl);
  local_18 = (code *)0x0;
  uStack_10 = 0;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  setEventCallback(this,(EventCallback *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  ::std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&this->_messageQueue);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_Json::Value_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_Json::Value_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->_cbs)._M_h);
  p_Var2 = (this->_eventCallback).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->_eventCallback,(_Any_data *)&this->_eventCallback,
              __destroy_functor);
  }
  Json::FastWriter::~FastWriter(&this->_jsonWriter);
  Json::Value::~Value(&this->_pdu);
  Json::Value::~Value(&this->_body);
  pcVar3 = (this->_roleSecret)._M_dataplus._M_p;
  paVar1 = &(this->_roleSecret).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->_roleName)._M_dataplus._M_p;
  paVar1 = &(this->_roleName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  ::std::unique_ptr<ix::WebSocket,_std::default_delete<ix::WebSocket>_>::~unique_ptr
            (&this->_webSocket);
  return;
}

Assistant:

CobraConnection::~CobraConnection()
    {
        disconnect();
        setEventCallback(nullptr);
    }